

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

void __thiscall
testing::internal::ScopedTrace::ScopedTrace(ScopedTrace *this,char *file,int line,Message *message)

{
  TraceInfo trace;
  Message *in_stack_ffffffffffffff78;
  TraceInfo *in_stack_ffffffffffffff88;
  UnitTest *in_stack_ffffffffffffff90;
  string local_40 [64];
  
  TraceInfo::TraceInfo((TraceInfo *)0x31178d);
  Message::GetString_abi_cxx11_(in_stack_ffffffffffffff78);
  std::__cxx11::string::operator=(local_40,(string *)&stack0xffffffffffffff90);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
  UnitTest::GetInstance();
  UnitTest::PushGTestTrace(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  TraceInfo::~TraceInfo((TraceInfo *)0x3117fb);
  return;
}

Assistant:

GTEST_LOCK_EXCLUDED_(&UnitTest::mutex_) {
  TraceInfo trace;
  trace.file = file;
  trace.line = line;
  trace.message = message.GetString();

  UnitTest::GetInstance()->PushGTestTrace(trace);
}